

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O1

void xc_available_functional_numbers(int *list)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  piVar3 = &xc_functional_keys[0].number;
  lVar2 = 1;
  lVar6 = -0x100000000;
  do {
    lVar6 = lVar6 + 0x100000000;
    lVar2 = lVar2 + -1;
    iVar1 = *piVar3;
    piVar3 = piVar3 + 0x41;
  } while (iVar1 != -1);
  if (lVar2 != 0) {
    uVar4 = 1;
    if (1 < -(int)lVar2) {
      uVar4 = (ulong)(uint)-(int)lVar2;
    }
    piVar3 = &xc_functional_keys[0].number;
    uVar5 = 0;
    do {
      list[uVar5] = *piVar3;
      uVar5 = uVar5 + 1;
      piVar3 = piVar3 + 0x41;
    } while (uVar4 != uVar5);
  }
  qsort(list,lVar6 >> 0x20,4,compare_int);
  return;
}

Assistant:

void xc_available_functional_numbers(int *list)
{
  int ii, N;
  N=xc_number_of_functionals();
  for(ii=0;ii<N;ii++){
    list[ii]=xc_functional_keys[ii].number;
  }
  /* Sort list by id */
  qsort(list, N, sizeof(int), compare_int);
}